

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

void Aig_ManRegPartitionAdd(Aig_ManPre_t *p,int iReg)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  void *pvVar5;
  Vec_Flt_t *pVVar6;
  float *pfVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  
  if (p->pfUsedRegs[iReg] == '\0') {
    p->pfUsedRegs[iReg] = '\x01';
    Vec_IntPush(p->vUniques,iReg);
  }
  pVVar3 = p->vFreeVars;
  uVar1 = pVVar3->nSize;
  if ((int)uVar1 < 1) {
    if (p->pfPartVars[iReg] != '\0') {
      __assert_fail("!p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                    ,0xdb,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
  }
  else {
    if (p->pfPartVars[iReg] == '\0') {
      __assert_fail("p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                    ,0xd6,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
    if (*pVVar3->pArray == iReg) {
      bVar16 = true;
      uVar9 = 0;
    }
    else {
      uVar12 = 0;
      do {
        if ((ulong)uVar1 - 1 == uVar12) {
          bVar16 = false;
          uVar9 = (ulong)uVar1;
          goto LAB_00636c61;
        }
        uVar9 = uVar12 + 1;
        lVar15 = uVar12 + 1;
        uVar12 = uVar9;
      } while (pVVar3->pArray[lVar15] != iReg);
      bVar16 = uVar9 < uVar1;
    }
LAB_00636c61:
    uVar8 = (uint)uVar9;
    if (uVar8 == uVar1) {
LAB_00636ded:
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                    ,0xd8,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
    if (!bVar16) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x3dc,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar11 = uVar1;
    if ((int)(uVar8 + 1) < (int)uVar1) {
      piVar4 = pVVar3->pArray;
      piVar10 = piVar4 + (uVar8 + 1);
      uVar9 = uVar9 & 0xffffffff;
      do {
        iVar13 = (int)uVar9;
        piVar4[uVar9] = *piVar10;
        uVar11 = pVVar3->nSize;
        piVar10 = piVar10 + 1;
        uVar9 = (ulong)(iVar13 + 1);
      } while (iVar13 + 2 < (int)uVar11);
    }
    pVVar3->nSize = uVar11 - 1;
    if (uVar8 == uVar1) goto LAB_00636ded;
  }
  p->pfPartVars[iReg] = '\x01';
  Vec_IntPush(p->vRegs,iReg);
  if ((iReg < 0) || (p->vMatrix->nSize <= iReg)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar5 = p->vMatrix->pArray[(uint)iReg];
  if (0 < *(int *)((long)pvVar5 + 4)) {
    lVar15 = 0;
    do {
      iVar13 = *(int *)(*(long *)((long)pvVar5 + 8) + lVar15 * 4);
      if (p->pfPartVars[iVar13] == '\0') {
        p->pfPartVars[iVar13] = '\x01';
        Vec_IntPush(p->vFreeVars,iVar13);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)((long)pvVar5 + 4));
  }
  pVVar6 = p->vPartCost;
  iVar13 = p->vFreeVars->nSize;
  iVar2 = p->vRegs->nSize;
  uVar1 = pVVar6->nCap;
  if (pVVar6->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar6->pArray == (float *)0x0) {
        pfVar7 = (float *)malloc(0x40);
      }
      else {
        pfVar7 = (float *)realloc(pVVar6->pArray,0x40);
      }
      pVVar6->pArray = pfVar7;
      iVar14 = 0x10;
    }
    else {
      iVar14 = uVar1 * 2;
      if (iVar14 <= (int)uVar1) goto LAB_00636d9f;
      if (pVVar6->pArray == (float *)0x0) {
        pfVar7 = (float *)malloc((ulong)uVar1 << 3);
      }
      else {
        pfVar7 = (float *)realloc(pVVar6->pArray,(ulong)uVar1 << 3);
      }
      pVVar6->pArray = pfVar7;
    }
    pVVar6->nCap = iVar14;
  }
LAB_00636d9f:
  iVar14 = pVVar6->nSize;
  pVVar6->nSize = iVar14 + 1;
  pVVar6->pArray[iVar14] = (float)iVar13 / (float)iVar2;
  return;
}

Assistant:

void Aig_ManRegPartitionAdd( Aig_ManPre_t * p, int iReg )
{
    Vec_Int_t * vSupp;
    int RetValue, iVar, i;
    // make sure this is a new variable
//    assert( !p->pfUsedRegs[iReg] );
    if ( !p->pfUsedRegs[iReg] )
    {
        p->pfUsedRegs[iReg] = 1;
        Vec_IntPush( p->vUniques, iReg );
    }
    // remove it from the free variables
    if ( Vec_IntSize(p->vFreeVars) > 0 )
    {
        assert( p->pfPartVars[iReg] );
        RetValue = Vec_IntRemove( p->vFreeVars, iReg );
        assert( RetValue );
    }
    else
        assert( !p->pfPartVars[iReg] );
    // add it to the partition
    p->pfPartVars[iReg] = 1;
    Vec_IntPush( p->vRegs, iReg );
    // add new variables
    vSupp = (Vec_Int_t *)Vec_PtrEntry( p->vMatrix, iReg );
    Vec_IntForEachEntry( vSupp, iVar, i )
    {
        if ( p->pfPartVars[iVar] )
            continue;
        p->pfPartVars[iVar] = 1;
        Vec_IntPush( p->vFreeVars, iVar );
    }
    // add it to the cost
    Vec_FltPush( p->vPartCost, 1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs) );
}